

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O2

void aAppGrabInput(int grab)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  if (a_app_state->grabbed != grab) {
    if (grab == 0) {
      XFixesShowCursor(a__x11_0);
      XUngrabPointer(a__x11_0,0);
      a__app_state.grabbed = grab;
    }
    else {
      uVar2 = 0;
      uVar3 = 0;
      uVar1 = a__x11_1;
      XGrabPointer();
      XFixesHideCursor(a__x11_0,a__x11_1);
      XWarpPointer(a__x11_0,0,a__x11_1,0,0,0,uVar1 & 0xffffffff00000000,
                   CONCAT44(uVar2,a__app_state.width >> 1),CONCAT44(uVar3,a__app_state.height >> 1))
      ;
      a__app_state.grabbed = grab;
    }
  }
  return;
}

Assistant:

void aAppGrabInput(int grab) {
	if (grab == a_app_state->grabbed)
		return;
	if (grab) {
		XGrabPointer(
			a__x11.display, a__x11.window, True, 0, GrabModeAsync, GrabModeAsync, a__x11.window, None, CurrentTime);
		XFixesHideCursor(a__x11.display, a__x11.window);
		XWarpPointer(a__x11.display, None, a__x11.window, 0, 0, 0, 0, a__app_state.width / 2, a__app_state.height / 2);
	} else {
		XFixesShowCursor(a__x11.display, a__x11.window);
		XUngrabPointer(a__x11.display, CurrentTime);
	}
	a__app_state.grabbed = grab;
}